

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

void * nghttp2_session_get_stream_user_data(nghttp2_session *session,int32_t stream_id)

{
  void *pvVar1;
  
  pvVar1 = nghttp2_map_find(&session->streams,stream_id);
  if (((pvVar1 == (void *)0x0) || ((*(byte *)((long)pvVar1 + 0xd8) & 2) != 0)) ||
     (*(int *)((long)pvVar1 + 0xcc) == 5)) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = *(void **)((long)pvVar1 + 0x90);
  }
  return pvVar1;
}

Assistant:

void *nghttp2_session_get_stream_user_data(nghttp2_session *session,
                                           int32_t stream_id) {
  nghttp2_stream *stream;
  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream) {
    return stream->stream_user_data;
  } else {
    return NULL;
  }
}